

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateClassifierFeatureDescriptions
                   (Result *__return_storage_ptr__,ModelDescription *interface,
                   bool expected_class_is_int64)

{
  string *features;
  string *features_00;
  bool bVar1;
  Result *result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_49;
  string local_48;
  TypeCase local_28 [2];
  
  features = (interface->predictedfeaturename_).ptr_;
  if (features->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Specification is missing classifier predictedFeatureName",
               (allocator<char> *)local_28);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    features_00 = (interface->predictedprobabilitiesname_).ptr_;
    local_28[0] = (uint)!expected_class_is_int64 * 2 + 1;
    __l._M_len = 1;
    __l._M_array = local_28;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_48,__l,&local_49);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (__return_storage_ptr__,(CoreML *)&interface->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)features,&local_48,
               in_R8);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_48);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      if (features_00->_M_string_length != 0) {
        local_28[0] = kMultiArrayType;
        local_28[1] = kDictionaryType;
        __l_00._M_len = 2;
        __l_00._M_array = local_28;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_48,__l_00,&local_49);
        validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (__return_storage_ptr__,(CoreML *)&interface->output_,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)features_00,
                   &local_48,in_R8);
        std::
        _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_48);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierFeatureDescriptions(const Specification::ModelDescription& interface,
                                                 bool expected_class_is_int64) {

        const auto& predictedFeatureName = interface.predictedfeaturename();
        const auto& probOutputName = interface.predictedprobabilitiesname();

        if (predictedFeatureName.empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing classifier predictedFeatureName");
        } else {
            auto expected_class = (expected_class_is_int64
                                   ? Specification::FeatureType::TypeCase::kInt64Type
                                   : Specification::FeatureType::TypeCase::kStringType);

            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            predictedFeatureName,
                                                                            {expected_class});
            if (!result.good()) {
                return result;
            }
        }

        if (!probOutputName.empty()) {
            // TODO @znation: validate array length below
            // and value type (must be double? different for different classifiers?)
            // TODO Probability outputs are always dictionaries!
            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            probOutputName,
                                                                            {Specification::FeatureType::TypeCase::kMultiArrayType, // TODO ARRAY TYPE IS INVALID, REMOVE
                                                                            Specification::FeatureType::TypeCase::kDictionaryType});
            if (!result.good()) {
                return result;
            }
        }

        return Result();
    }